

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestAES256CBC
          (CryptoTest *this,string *hexkey,string *hexiv,bool pad,string *hexin,string *hexout)

{
  long lVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  int iVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  string *psVar3;
  iterator pvVar4;
  string *psVar5;
  iterator pvVar6;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  const_string file;
  const_string file_00;
  Span<const_unsigned_char> s;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s_00;
  const_string file_03;
  const_string file_04;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  check_type cVar7;
  char *local_520;
  char *local_518;
  allocator<char> local_509;
  assertion_result local_508;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> subdecrypted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> subout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sub;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  vector<unsigned_char,_std::allocator<unsigned_char>_> decrypted;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  vector<unsigned_char,_std::allocator<unsigned_char>_> realout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> correctout;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  AES256CBCDecrypt dec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_150;
  AES256CBCEncrypt enc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (hexkey->_M_dataplus)._M_p;
  hex_str._M_len = hexkey->_M_string_length;
  psVar3 = hexin;
  psVar5 = hexout;
  ParseHex<unsigned_char>(&key,hex_str);
  hex_str_00._M_str = (hexiv->_M_dataplus)._M_p;
  hex_str_00._M_len = hexiv->_M_string_length;
  ParseHex<unsigned_char>(&iv,hex_str_00);
  hex_str_01._M_str = (hexin->_M_dataplus)._M_p;
  hex_str_01._M_len = hexin->_M_string_length;
  ParseHex<unsigned_char>(&in,hex_str_01);
  hex_str_02._M_str = (hexout->_M_dataplus)._M_p;
  hex_str_02._M_len = hexout->_M_string_length;
  ParseHex<unsigned_char>(&correctout,hex_str_02);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&realout,(CONCAT44(in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                (int)in.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish) -
                      (long)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) + 0x10,(allocator_type *)&enc)
  ;
  AES256CBCEncrypt::AES256CBCEncrypt
            (&enc,key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
             iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,pad);
  iVar2 = AES256CBCEncrypt::Encrypt
                    (&enc,in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                     (int)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                     (int)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                     realout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&realout,(long)iVar2);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6d;
  file.m_begin = (iterator)&local_390;
  msg.m_end = (iterator)psVar5;
  msg.m_begin = (iterator)psVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3a0,msg);
  local_160[0] = (long)realout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)realout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start ==
                 CONCAT44(correctout.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish._4_4_,
                          (int)correctout.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish) -
                 (long)correctout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
  local_160._8_8_ = (element_type *)0x0;
  aStack_150._M_allocated_capacity = 0;
  dec.dec.ctx.rk[1].slice._8_8_ = &local_180;
  local_180._M_dataplus._M_p = "realout.size() == correctout.size()";
  local_180._M_string_length = 0xb9048b;
  dec.dec.ctx.rk[0].slice[4]._0_1_ = 0;
  dec.dec.ctx.rk[0].slice._0_8_ = &PTR__lazy_ostream_011481f0;
  dec.dec.ctx.rk[1].slice._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_3a8 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_160,(lazy_ostream *)&dec,1,0,WARN,_cVar7,(size_t)&local_3b0,
             0x6d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_150._M_allocated_capacity);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6e;
  file_00.m_begin = (iterator)&local_3c0;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3d0,
             msg_00);
  local_2e8._M_dataplus._M_p._0_1_ = std::operator==(&realout,&correctout);
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_allocated_capacity = 0;
  s.m_size = (long)realout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)realout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start;
  s.m_data = realout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_1a0,s);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0," != ",(allocator<char> *)&local_308);
  std::operator+(&local_180,&local_1a0,&local_1c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                 &local_180,hexout);
  dec.dec.ctx.rk[0].slice[4]._0_1_ = 0;
  dec.dec.ctx.rk[0].slice._0_8_ = &PTR__lazy_ostream_01147fb0;
  dec.dec.ctx.rk[1].slice._0_8_ = boost::unit_test::lazy_ostream::inst;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_3d8 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  dec.dec.ctx.rk[1].slice._8_8_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_2e8,(lazy_ostream *)&dec,1,1,WARN,_cVar7,(size_t)&local_3e0,
             0x6e);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_2e8.field_2._M_allocated_capacity);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&decrypted,
             CONCAT44(correctout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)correctout.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish) -
             (long)correctout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,(allocator_type *)&dec);
  AES256CBCDecrypt::AES256CBCDecrypt
            (&dec,key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
             iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,pad);
  iVar2 = AES256CBCDecrypt::Decrypt
                    (&dec,correctout.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                     (int)correctout.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)correctout.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                     decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&decrypted,(long)iVar2);
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x75;
  file_01.m_begin = (iterator)&local_408;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_418,
             msg_01);
  local_180._M_dataplus._M_p._0_1_ =
       (long)decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start ==
       CONCAT44(in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_,
                (int)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish) -
       (long)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_180._M_string_length = 0;
  local_180.field_2._M_allocated_capacity = 0;
  local_1a0._M_dataplus._M_p = "decrypted.size() == in.size()";
  local_1a0._M_string_length = 0xb904a9;
  local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
  local_160._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_420 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = (iterator)0x0;
  aStack_150._8_8_ = &local_1a0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_180,(lazy_ostream *)local_160,1,0,WARN,_cVar7,
             (size_t)&local_428,0x75);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_180.field_2._M_allocated_capacity);
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x76;
  file_02.m_begin = (iterator)&local_438;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_448,
             msg_02);
  local_308._M_dataplus._M_p._0_1_ = std::operator==(&decrypted,&in);
  local_308._M_string_length = 0;
  local_308.field_2._M_allocated_capacity = 0;
  s_00.m_size = (long)decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  s_00.m_data = decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  HexStr_abi_cxx11_(&local_1c0,s_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8," != ",(allocator<char> *)&sub);
  std::operator+(&local_1a0,&local_1c0,&local_2e8);
  std::operator+(&local_180,&local_1a0,hexin);
  local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
  local_160._0_8_ = &PTR__lazy_ostream_01147fb0;
  aStack_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp";
  local_450 = "";
  pvVar4 = &DAT_00000001;
  pvVar6 = &DAT_00000001;
  aStack_150._8_8_ = &local_180;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_308,(lazy_ostream *)local_160,1,1,WARN,_cVar7,
             (size_t)&local_458,0x76);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_1c0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_308.field_2._M_allocated_capacity);
  __first._M_current =
       in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    __last._M_current._4_4_ =
         in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish._4_4_;
    __last._M_current._0_4_ =
         (int)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__first._M_current == __last._M_current) break;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&sub,__first,__last,
               (allocator_type *)local_160);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&subout,(CONCAT44(sub.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)sub.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish) -
                       (long)sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start) + 0x10,
               (allocator_type *)local_160);
    iVar2 = AES256CBCEncrypt::Encrypt
                      (&enc,sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       (int)sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                       subout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    if (iVar2 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&subout,(long)iVar2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&subdecrypted,
                 CONCAT44(subout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                          (int)subout.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish) -
                 (long)subout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,(allocator_type *)local_160);
      iVar2 = AES256CBCDecrypt::Decrypt
                        (&dec,subout.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                         (int)subout.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                         (int)subout.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                         subdecrypted.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&subdecrypted,(long)iVar2);
      local_4b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_4a8 = "";
      local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x84;
      file_03.m_begin = (iterator)&local_4b0;
      msg_03.m_end = pvVar6;
      msg_03.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_4c0,
                 msg_03);
      local_180._M_dataplus._M_p._0_1_ =
           (long)decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start ==
           CONCAT44(in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish._4_4_,
                    (int)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish) -
           (long)in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_180._M_string_length = 0;
      local_180.field_2._M_allocated_capacity = 0;
      local_1a0._M_dataplus._M_p = "decrypted.size() == in.size()";
      local_1a0._M_string_length = 0xb904a9;
      local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
      local_160._0_8_ = &PTR__lazy_ostream_011481f0;
      aStack_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_4d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_4c8 = "";
      pvVar4 = &DAT_00000001;
      pvVar6 = (iterator)0x0;
      aStack_150._8_8_ = &local_1a0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_180,(lazy_ostream *)local_160,1,0,WARN,_cVar7,
                 (size_t)&local_4d0,0x84);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_180.field_2._M_allocated_capacity);
      local_4e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_4d8 = "";
      local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x85;
      file_04.m_begin = (iterator)&local_4e0;
      msg_04.m_end = pvVar6;
      msg_04.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4f0,
                 msg_04);
      local_508.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)std::operator==(&subdecrypted,&sub);
      local_508.m_message.px = (element_type *)0x0;
      local_508.m_message.pn.pi_ = (sp_counted_base *)0x0;
      s_01.m_size = (long)subdecrypted.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)subdecrypted.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
      s_01.m_data = subdecrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      HexStr_abi_cxx11_(&local_1c0,s_01);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8," != ",&local_509);
      std::operator+(&local_1a0,&local_1c0,&local_2e8);
      s_02.m_size = CONCAT44(sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (int)sub.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish) -
                    (long)sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      s_02.m_data = sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      HexStr_abi_cxx11_(&local_308,s_02);
      std::operator+(&local_180,&local_1a0,&local_308);
      local_160._8_8_ = local_160._8_8_ & 0xffffffffffffff00;
      local_160._0_8_ = &PTR__lazy_ostream_01147fb0;
      aStack_150._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_520 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
      ;
      local_518 = "";
      pvVar4 = &DAT_00000001;
      pvVar6 = &DAT_00000001;
      aStack_150._8_8_ = &local_180;
      boost::test_tools::tt_detail::report_assertion
                (&local_508,(lazy_ostream *)local_160,1,1,WARN,_cVar7,(size_t)&local_520,0x85);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_1c0);
      boost::detail::shared_count::~shared_count(&local_508.m_message.pn);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&subdecrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&subout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&sub.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    __first._M_current = __first._M_current + 1;
  }
  AES256CBCDecrypt::~AES256CBCDecrypt(&dec);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&decrypted.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  AES256CBCEncrypt::~AES256CBCEncrypt(&enc);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&realout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&correctout.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&iv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestAES256CBC(const std::string &hexkey, const std::string &hexiv, bool pad, const std::string &hexin, const std::string &hexout)
{
    std::vector<unsigned char> key = ParseHex(hexkey);
    std::vector<unsigned char> iv = ParseHex(hexiv);
    std::vector<unsigned char> in = ParseHex(hexin);
    std::vector<unsigned char> correctout = ParseHex(hexout);
    std::vector<unsigned char> realout(in.size() + AES_BLOCKSIZE);

    // Encrypt the plaintext and verify that it equals the cipher
    AES256CBCEncrypt enc(key.data(), iv.data(), pad);
    int size = enc.Encrypt(in.data(), in.size(), realout.data());
    realout.resize(size);
    BOOST_CHECK(realout.size() == correctout.size());
    BOOST_CHECK_MESSAGE(realout == correctout, HexStr(realout) + std::string(" != ") + hexout);

    // Decrypt the cipher and verify that it equals the plaintext
    std::vector<unsigned char> decrypted(correctout.size());
    AES256CBCDecrypt dec(key.data(), iv.data(), pad);
    size = dec.Decrypt(correctout.data(), correctout.size(), decrypted.data());
    decrypted.resize(size);
    BOOST_CHECK(decrypted.size() == in.size());
    BOOST_CHECK_MESSAGE(decrypted == in, HexStr(decrypted) + std::string(" != ") + hexin);

    // Encrypt and re-decrypt substrings of the plaintext and verify that they equal each-other
    for(std::vector<unsigned char>::iterator i(in.begin()); i != in.end(); ++i)
    {
        std::vector<unsigned char> sub(i, in.end());
        std::vector<unsigned char> subout(sub.size() + AES_BLOCKSIZE);
        int _size = enc.Encrypt(sub.data(), sub.size(), subout.data());
        if (_size != 0)
        {
            subout.resize(_size);
            std::vector<unsigned char> subdecrypted(subout.size());
            _size = dec.Decrypt(subout.data(), subout.size(), subdecrypted.data());
            subdecrypted.resize(_size);
            BOOST_CHECK(decrypted.size() == in.size());
            BOOST_CHECK_MESSAGE(subdecrypted == sub, HexStr(subdecrypted) + std::string(" != ") + HexStr(sub));
        }
    }
}